

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.h
# Opt level: O2

Analysis __thiscall
spvtools::opt::AnalyzeLiveInputPass::GetPreservedAnalyses(AnalyzeLiveInputPass *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisLoopAnalysis|
         kAnalysisDominatorAnalysis|kAnalysisCFG|kAnalysisCombinators|kAnalysisInstrToBlockMapping|
         kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }